

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastener::IfcMechanicalFastener(IfcMechanicalFastener *this)

{
  *(undefined ***)&this->field_0x188 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(char **)&this->field_0x198 = "IfcMechanicalFastener";
  IfcFastener::IfcFastener(&this->super_IfcFastener,&PTR_construction_vtable_24__007c3250);
  *(undefined8 *)&(this->super_IfcFastener).field_0x160 = 0;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject = 0x7c30f8;
  *(undefined8 *)&this->field_0x188 = 0x7c3238;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0x88 = 0x7c3120;
  (this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
  super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7c3148;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0xd0 = 0x7c3170;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    field_0x100 = 0x7c3198;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x138 =
       0x7c31c0;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x148 =
       0x7c31e8;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.field_0x158 = 0x7c3210;
  this->field_0x170 = 0;
  (this->NominalLength).have = false;
  return;
}

Assistant:

IfcMechanicalFastener() : Object("IfcMechanicalFastener") {}